

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

Datatype * __thiscall TypeFactory::getBase(TypeFactory *this,int4 s,type_metatype m)

{
  Datatype *pDVar1;
  undefined1 local_68 [8];
  TypeBase tmp;
  Datatype *ct;
  type_metatype m_local;
  int4 s_local;
  TypeFactory *this_local;
  
  if (s < 9) {
    if (2 < (int)m) {
      pDVar1 = this->typecache[s][(int)(m - TYPE_FLOAT)];
      if (pDVar1 != (Datatype *)0x0) {
        return pDVar1;
      }
      tmp.super_Datatype.id = 0;
    }
  }
  else if (m == TYPE_FLOAT) {
    if (s == 10) {
      tmp.super_Datatype.id = (uint8)this->typecache10;
    }
    else if (s == 0x10) {
      tmp.super_Datatype.id = (uint8)this->typecache16;
    }
    else {
      tmp.super_Datatype.id = 0;
    }
    if (tmp.super_Datatype.id != 0) {
      return (Datatype *)tmp.super_Datatype.id;
    }
  }
  if (this->glb->max_basetype_size < s) {
    tmp.super_Datatype.id = (uint8)this->typecache[1][5];
    tmp.super_Datatype.id = (uint8)getTypeArray(this,s,(Datatype *)tmp.super_Datatype.id);
    this_local = (TypeFactory *)findAdd(this,(Datatype *)tmp.super_Datatype.id);
  }
  else {
    TypeBase::TypeBase((TypeBase *)local_68,s,m);
    this_local = (TypeFactory *)findAdd(this,(Datatype *)local_68);
    TypeBase::~TypeBase((TypeBase *)local_68);
  }
  return (Datatype *)this_local;
}

Assistant:

Datatype *TypeFactory::getBase(int4 s,type_metatype m)

{
  Datatype *ct;
  if (s<9) {
    if (m >= TYPE_FLOAT) {
      ct = typecache[s][m-TYPE_FLOAT];
      if (ct != (Datatype *)0)
	return ct;
    }
  }
  else if (m==TYPE_FLOAT) {
    if (s==10)
      ct = typecache10;
    else if (s==16)
      ct = typecache16;
    else
      ct = (Datatype *)0;
    if (ct != (Datatype *)0)
      return ct;
  }
  if (s > glb->max_basetype_size) {
    // Create array of unknown bytes to match size
    ct = typecache[1][TYPE_UNKNOWN-TYPE_FLOAT];
    ct = getTypeArray(s,ct);
    return findAdd(*ct);
  }
  TypeBase tmp(s,m);
  return findAdd(tmp);
}